

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O3

int mcpl2ssw_parse_args(int argc,char **argv,char **inmcplfile,char **refsswfile,char **outsswfile,
                       long *nparticles_limit,long *surface_id)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  char **ppcVar4;
  size_t sVar5;
  ulong *puVar6;
  char cVar7;
  char *pcVar8;
  ulong uVar9;
  int64_t opt_num_limit;
  ulong local_58;
  char **local_50;
  long local_48;
  ulong *local_40;
  ulong local_38;
  
  *inmcplfile = (char *)0x0;
  *refsswfile = (char *)0x0;
  *outsswfile = (char *)0x0;
  *nparticles_limit = 0x7fffffff;
  *surface_id = 0;
  local_58 = 0xffffffffffffffff;
  local_48 = -1;
  local_50 = inmcplfile;
  local_40 = (ulong *)nparticles_limit;
  if (1 < argc) {
    local_38 = (ulong)(uint)argc;
    uVar9 = 1;
    do {
      pcVar8 = argv[uVar9];
      sVar3 = strlen(pcVar8);
      if (sVar3 != 0) {
        if (sVar3 == 1) {
          cVar7 = *pcVar8;
        }
        else {
          cVar7 = *pcVar8;
          if ((cVar7 == '-') && (pcVar8[1] != '-')) {
            sVar5 = 1;
            puVar6 = (ulong *)0x0;
            do {
              cVar7 = pcVar8[sVar5];
              if (puVar6 == (ulong *)0x0) {
                puVar6 = &local_58;
                if (cVar7 != 'l') {
                  if (cVar7 != 's') {
                    if (cVar7 == 'h') goto LAB_00104c57;
                    pcVar8 = "Unrecognised option";
                    goto LAB_00104c86;
                  }
                  puVar6 = (ulong *)&local_48;
                }
                *puVar6 = 0;
                if (sVar5 + 1 == sVar3) {
                  pcVar8 = "Bad option: missing number";
                  goto LAB_00104c86;
                }
              }
              else {
                if ((byte)(cVar7 - 0x3aU) < 0xf6) {
                  pcVar8 = "Bad option: expected number";
                  goto LAB_00104c86;
                }
                lVar1 = *puVar6;
                *puVar6 = lVar1 * 10;
                *puVar6 = lVar1 * 10 + (long)pcVar8[sVar5] + -0x30;
              }
              sVar5 = sVar5 + 1;
            } while (sVar5 != sVar3);
            goto LAB_00104add;
          }
          if ((sVar3 == 6) && (iVar2 = strcmp(pcVar8,"--help"), iVar2 == 0)) {
LAB_00104c57:
            mcpl2ssw_app_usage(argv,(char *)0x0);
            return -1;
          }
        }
        if (cVar7 == '-') {
          pcVar8 = "Bad arguments";
          goto LAB_00104c86;
        }
        if (*outsswfile != (char *)0x0) {
          pcVar8 = "Too many arguments.";
          goto LAB_00104c86;
        }
        ppcVar4 = outsswfile;
        if ((*refsswfile == (char *)0x0) && (ppcVar4 = refsswfile, *local_50 == (char *)0x0)) {
          ppcVar4 = local_50;
        }
        *ppcVar4 = pcVar8;
      }
LAB_00104add:
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_38);
  }
  if (*local_50 == (char *)0x0) {
    pcVar8 = "Missing argument : input MCPL file";
  }
  else if (*refsswfile == (char *)0x0) {
    pcVar8 = "Missing argument : Reference SSW file";
  }
  else {
    if (*outsswfile == (char *)0x0) {
      *outsswfile = "output.ssw";
    }
    if ((long)local_58 < 1) {
      local_58 = 0x7fffffff;
    }
    else if (local_58 >> 0x1f != 0) {
      pcVar8 = "Parameter out of range : SSW files can only hold up to 2147483647 particles.";
      goto LAB_00104c86;
    }
    *local_40 = local_58;
    if (local_48 != 0 && local_48 < 1000000) {
      if (local_48 < 1) {
        local_48 = 0;
      }
      *surface_id = local_48;
      return 0;
    }
    pcVar8 = "Parameter out of range : Surface ID must be in range [1,999999].";
  }
LAB_00104c86:
  printf("ERROR: %s\n\n",pcVar8);
  puts("Run with -h or --help for usage information");
  return 1;
}

Assistant:

int mcpl2ssw_parse_args(int argc,const char **argv, const char** inmcplfile,
                        const char **refsswfile, const char **outsswfile,
                        long* nparticles_limit, long* surface_id) {
  //returns: 0 all ok, 1: error, -1: all ok but do nothing (-h/--help mode)
  *inmcplfile = 0;
  *refsswfile = 0;
  *outsswfile = 0;
  *nparticles_limit = INT32_MAX;
  *surface_id = 0;

  int64_t opt_num_limit = -1;
  int64_t opt_num_isurf = -1;
  int i;
  for (i = 1; i<argc; ++i) {
    const char * a = argv[i];
    size_t n = strlen(a);
    if (!n)
      continue;
    if (n>=2&&a[0]=='-'&&a[1]!='-') {
      //short options:
      int64_t * consume_digit = 0;
      size_t j;
      for (j=1; j<n; ++j) {
        if (consume_digit) {
          if (a[j]<'0'||a[j]>'9')
            return mcpl2ssw_app_usage(argv,"Bad option: expected number");
          *consume_digit *= 10;
          *consume_digit += a[j] - '0';
          continue;
        }
        switch(a[j]) {
        case 'h': mcpl2ssw_app_usage(argv,0); return -1;
        case 'l': consume_digit = &opt_num_limit; break;
        case 's': consume_digit = &opt_num_isurf; break;
        default:
          return mcpl2ssw_app_usage(argv,"Unrecognised option");
        }
        if (consume_digit) {
          *consume_digit = 0;
          if (j+1==n)
            return mcpl2ssw_app_usage(argv,"Bad option: missing number");
        }
      }

    } else if (n==6 && strcmp(a,"--help")==0) {
      mcpl2ssw_app_usage(argv,0);
      return -1;
    } else if (n>=1&&a[0]!='-') {
      if (*outsswfile)
        return mcpl2ssw_app_usage(argv,"Too many arguments.");
      if (*refsswfile) *outsswfile = a;
      else if (*inmcplfile) *refsswfile = a;
      else *inmcplfile = a;
    } else {
      return mcpl2ssw_app_usage(argv,"Bad arguments");
    }
  }

  if (!*inmcplfile)
    return mcpl2ssw_app_usage(argv,"Missing argument : input MCPL file");
  if (!*refsswfile)
    return mcpl2ssw_app_usage(argv,"Missing argument : Reference SSW file");
  if (!*outsswfile)
    *outsswfile = "output.ssw";

  if (opt_num_limit<=0)
    opt_num_limit = INT32_MAX;
  if (opt_num_limit>INT32_MAX)
    return mcpl2ssw_app_usage(argv,"Parameter out of range : SSW files can only hold up to 2147483647 particles.");
  *nparticles_limit = (long)opt_num_limit;

  if (opt_num_isurf==0||opt_num_isurf>999999)
    return mcpl2ssw_app_usage(argv,"Parameter out of range : Surface ID must be in range [1,999999].");
  if (opt_num_isurf<0)
    opt_num_isurf = 0;

  *surface_id = (long)opt_num_isurf;

  return 0;
}